

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floatingpoint_tests.cpp
# Opt level: O0

void __thiscall
floatingpoint_test::iu_FloatingpointTest_x_iutest_x_EXP_Test<double>::Body
          (iu_FloatingpointTest_x_iutest_x_EXP_Test<double> *this)

{
  bool bVar1;
  char *message;
  double dVar2;
  AssertionHelper local_208;
  Fixed local_1c8;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  int exp;
  iu_FloatingpointTest_x_iutest_x_EXP_Test<double> *this_local;
  
  dVar2 = log2(1024.0);
  iutest_ar._36_4_ = (BADTYPE)(dVar2 + 1.0);
  iutest::detail::AlwaysZero();
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_40,"exp","FloatType::kEXP",(int *)&iutest_ar.field_0x24,
             &iutest::floating_point<double>::kEXP);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1c8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1c8);
    message = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/floatingpoint_tests.cpp"
               ,0x36,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1c8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1c8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

IUTEST_TYPED_TEST(FloatingpointTest, EXP)
{
    typedef typename TestFixture::ftype FloatType;
    const int exp = static_cast<int>(log2(::std::numeric_limits<TypeParam>::max_exponent) + 1);
    IUTEST_EXPECT_EQ(exp, FloatType::kEXP);
}